

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# consolelog.hpp
# Opt level: O2

void __thiscall
github111116::ConsoleLogger::error<char[6],int,char[39]>
          (ConsoleLogger *this,char (*args) [6],int *args_1,char (*args_2) [39])

{
  if (3 < this->loglevel) {
    return;
  }
  std::mutex::lock(&this->mtx);
  if (this->colored == true) {
    std::operator<<(this->out,(string *)&this->errorColor);
  }
  std::operator<<(this->out,"[X] ");
  print<char[6],int,char[39]>(this,args,args_1,args_2);
  if (this->colored == true) {
    std::operator<<(this->out,"\x1b[0m");
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->mtx);
  return;
}

Assistant:

void ConsoleLogger::error(const Args&... args)
{
	if (loglevel > 3) return;
	mtx.lock();
	if (colored) out << errorColor;
	out << "[X] ";
	print(args...);
	if (colored) out << "\033[0m";
	mtx.unlock();
}